

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubDEdgePtr ON_SubDEdgePtr::CreateFromStartVertex(ON_SubDEdge *edge,ON_SubDVertex *start_vertex)

{
  ON__UINT_PTR local_28;
  ON__UINT_PTR dir;
  ON_SubDVertex *start_vertex_local;
  ON_SubDEdge *edge_local;
  
  if (((edge == (ON_SubDEdge *)0x0) || (start_vertex == (ON_SubDVertex *)0x0)) ||
     (edge->m_vertex[0] == edge->m_vertex[1])) {
LAB_008659f9:
    edge_local = (ON_SubDEdge *)0;
  }
  else {
    if (start_vertex == edge->m_vertex[0]) {
      local_28 = 0;
    }
    else {
      if (start_vertex != edge->m_vertex[1]) goto LAB_008659f9;
      local_28 = 1;
    }
    edge_local = (ON_SubDEdge *)Create(edge,local_28);
  }
  return (ON_SubDEdgePtr)(ON__UINT_PTR)edge_local;
}

Assistant:

const ON_SubDEdgePtr ON_SubDEdgePtr::CreateFromStartVertex(
  const class ON_SubDEdge* edge,
  const ON_SubDVertex* start_vertex
)
{
  for (;;)
  {
    if (nullptr == edge || nullptr == start_vertex)
      break;
    if (edge->m_vertex[0] == edge->m_vertex[1])
      break;
    
    ON__UINT_PTR dir;
    if (start_vertex == edge->m_vertex[0])
      dir = 0;
    else if (start_vertex == edge->m_vertex[1])
      dir = 1;
    else
      break;
    return ON_SubDEdgePtr::Create(edge, dir);
  }
  return ON_SubDEdgePtr::Null;
}